

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileLockPool.cxx
# Opt level: O1

bool __thiscall cmFileLockPool::IsAlreadyLocked(cmFileLockPool *this,string *filename)

{
  long *plVar1;
  _List_node_base *p_Var2;
  bool bVar3;
  bool bVar4;
  long *plVar5;
  _List_node_base *p_Var6;
  _List_node_base *p_Var7;
  ScopePool *pSVar8;
  cmFileLockPool *pcVar9;
  
  for (pcVar9 = (cmFileLockPool *)
                (this->FunctionScopes).
                super__List_base<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>
                ._M_impl._M_node.super__List_node_base._M_next; pcVar9 != this;
      pcVar9 = (cmFileLockPool *)
               (pcVar9->FunctionScopes).
               super__List_base<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>
               ._M_impl._M_node.super__List_node_base._M_next) {
    plVar1 = (long *)(pcVar9->FunctionScopes).
                     super__List_base<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>
                     ._M_impl._M_node._M_size;
    plVar5 = plVar1;
    do {
      plVar5 = (long *)*plVar5;
      if (plVar5 == plVar1) goto LAB_0043c086;
      bVar3 = cmFileLock::IsLocked((cmFileLock *)plVar5[2],filename);
    } while (!bVar3);
    if (plVar5 != plVar1) {
      if (pcVar9 != this) {
        return true;
      }
      break;
    }
LAB_0043c086:
  }
  p_Var7 = (this->FileScopes).
           super__List_base<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  do {
    bVar3 = p_Var7 != (_List_node_base *)&this->FileScopes;
    if (!bVar3) {
LAB_0043c0e5:
      pSVar8 = &this->ProcessScope;
      p_Var7 = (_List_node_base *)pSVar8;
      do {
        p_Var7 = (((List *)&p_Var7->_M_next)->
                 super__List_base<cmFileLock_*,_std::allocator<cmFileLock_*>_>)._M_impl._M_node.
                 super__List_node_base._M_next;
        bVar3 = p_Var7 != (_List_node_base *)pSVar8;
        if (p_Var7 == (_List_node_base *)pSVar8) {
          return bVar3;
        }
        bVar4 = cmFileLock::IsLocked(*(cmFileLock **)(p_Var7 + 1),filename);
      } while (!bVar4);
      return bVar3;
    }
    p_Var2 = p_Var7[1]._M_next;
    p_Var6 = p_Var2;
    do {
      p_Var6 = p_Var6->_M_next;
      if (p_Var6 == p_Var2) goto LAB_0043c0d2;
      bVar4 = cmFileLock::IsLocked((cmFileLock *)p_Var6[1]._M_next,filename);
    } while (!bVar4);
    if (p_Var6 != p_Var2) {
      if (bVar3) {
        return true;
      }
      goto LAB_0043c0e5;
    }
LAB_0043c0d2:
    p_Var7 = p_Var7->_M_next;
  } while( true );
}

Assistant:

bool cmFileLockPool::IsAlreadyLocked(const std::string& filename) const
{
  for (CIt i = this->FunctionScopes.begin();
      i != this->FunctionScopes.end(); ++i)
    {
    const bool result = (*i)->IsAlreadyLocked(filename);
    if (result)
      {
      return true;
      }
    }

  for (CIt i = this->FileScopes.begin(); i != this->FileScopes.end(); ++i)
    {
    const bool result = (*i)->IsAlreadyLocked(filename);
    if (result)
      {
      return true;
      }
    }

  return this->ProcessScope.IsAlreadyLocked(filename);
}